

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::BinaryLambdaWrapper,bool,duckdb::dtime_tz_t(*)(duckdb::interval_t,duckdb::dtime_tz_t),false,true>
               (interval_t *ldata,dtime_tz_t *rdata,dtime_tz_t *result_data,idx_t count,
               ValidityMask *mask,_func_dtime_tz_t_interval_t_dtime_tz_t *fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  unsigned_long *puVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  dtime_tz_t dVar8;
  dtime_tz_t dVar9;
  ulong uVar10;
  int64_t *piVar11;
  idx_t iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  interval_t iVar17;
  interval_t iVar18;
  interval_t iVar19;
  int64_t *local_70;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      dVar9 = (dtime_tz_t)rdata->bits;
      local_70 = &ldata->micros;
      iVar12 = 0;
      do {
        uVar3 = ((interval_t *)(local_70 + -1))->months;
        uVar7 = ((interval_t *)(local_70 + -1))->days;
        iVar19.days = uVar7;
        iVar19.months = uVar3;
        iVar19.micros = *local_70;
        dVar8 = (*fun)(iVar19,dVar9);
        result_data[iVar12].bits = dVar8.bits;
        iVar12 = iVar12 + 1;
        local_70 = local_70 + 2;
      } while (count != iVar12);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar10 = 0;
    uVar16 = 0;
    do {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        uVar13 = 0xffffffffffffffff;
      }
      else {
        uVar13 = puVar4[uVar10];
      }
      uVar15 = uVar16 + 0x40;
      if (count <= uVar16 + 0x40) {
        uVar15 = count;
      }
      uVar14 = uVar15;
      if (uVar13 != 0) {
        uVar14 = uVar16;
        if (uVar13 == 0xffffffffffffffff) {
          if (uVar16 < uVar15) {
            dVar9 = (dtime_tz_t)rdata->bits;
            piVar11 = &ldata[uVar16].micros;
            do {
              uVar1 = ((interval_t *)(piVar11 + -1))->months;
              uVar5 = ((interval_t *)(piVar11 + -1))->days;
              iVar17.days = uVar5;
              iVar17.months = uVar1;
              iVar17.micros = *piVar11;
              dVar8 = (*fun)(iVar17,dVar9);
              result_data[uVar16].bits = dVar8.bits;
              uVar16 = uVar16 + 1;
              piVar11 = piVar11 + 2;
              uVar14 = uVar16;
            } while (uVar15 != uVar16);
          }
        }
        else if (uVar16 < uVar15) {
          piVar11 = &ldata[uVar16].micros;
          uVar14 = 0;
          do {
            if ((uVar13 >> (uVar14 & 0x3f) & 1) != 0) {
              uVar2 = ((interval_t *)(piVar11 + -1))->months;
              uVar6 = ((interval_t *)(piVar11 + -1))->days;
              iVar18.days = uVar6;
              iVar18.months = uVar2;
              iVar18.micros = *piVar11;
              dVar9 = (*fun)(iVar18,rdata->bits);
              result_data[uVar16 + uVar14].bits = dVar9.bits;
            }
            uVar14 = uVar14 + 1;
            piVar11 = piVar11 + 2;
          } while ((uVar16 - uVar15) + uVar14 != 0);
          uVar14 = uVar16 + uVar14;
        }
      }
      uVar10 = uVar10 + 1;
      uVar16 = uVar14;
    } while (uVar10 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}